

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bond.hpp
# Opt level: O0

void __thiscall OpenMD::Bond::calcForce(Bond *this,bool doParticlePot)

{
  long *plVar1;
  reference ppAVar2;
  byte in_SIL;
  StuntDouble *in_RDI;
  Vector3d force;
  Vector3d r12;
  RealType dvdr;
  RealType len;
  Vector<double,_3U> *in_stack_ffffffffffffff08;
  Vector<double,_3U> *in_stack_ffffffffffffff10;
  value_type this_00;
  StuntDouble *in_stack_ffffffffffffff20;
  Vector3d *in_stack_ffffffffffffff88;
  Snapshot *in_stack_ffffffffffffff90;
  undefined1 local_20 [8];
  double local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  Vector3<double>::Vector3((Vector3<double> *)0x141f75);
  Vector3<double>::Vector3((Vector3<double> *)0x141f82);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&in_RDI->storage_,1);
  StuntDouble::getPos(in_RDI);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&in_RDI->storage_,0);
  StuntDouble::getPos(in_RDI);
  OpenMD::operator-((Vector<double,_3U> *)in_RDI,in_stack_ffffffffffffff10);
  Vector3<double>::operator=((Vector3<double> *)in_RDI,in_stack_ffffffffffffff10);
  SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)&in_RDI->objType_);
  Snapshot::wrapVector(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_18 = Vector<double,_3U>::length((Vector<double,_3U> *)0x142018);
  plVar1 = (long *)(in_RDI->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (**(code **)(*plVar1 + 0x10))
            (local_18,plVar1,
             &(in_RDI->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
             local_20);
  OpenMD::operator*((Vector<double,_3U> *)in_RDI,(double)in_stack_ffffffffffffff10);
  Vector3<double>::operator=((Vector3<double> *)in_RDI,in_stack_ffffffffffffff10);
  ppAVar2 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                      ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&in_RDI->storage_,
                       0);
  this_00 = *ppAVar2;
  OpenMD::operator-((Vector<double,_3U> *)in_RDI);
  Vector3<double>::Vector3((Vector3<double> *)this_00,in_stack_ffffffffffffff08);
  StuntDouble::addFrc(in_stack_ffffffffffffff20,(Vector3d *)in_RDI);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&in_RDI->storage_,1);
  StuntDouble::addFrc(in_stack_ffffffffffffff20,(Vector3d *)in_RDI);
  if ((local_9 & 1) != 0) {
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&in_RDI->storage_,0);
    StuntDouble::addParticlePot(in_stack_ffffffffffffff20,(RealType *)in_RDI);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&in_RDI->storage_,1);
    StuntDouble::addParticlePot(in_stack_ffffffffffffff20,(RealType *)in_RDI);
  }
  return;
}

Assistant:

void calcForce(bool doParticlePot) {
      RealType len;
      RealType dvdr;
      Vector3d r12;
      Vector3d force;

      r12 = atoms_[1]->getPos() - atoms_[0]->getPos();
      snapshotMan_->getCurrentSnapshot()->wrapVector(r12);
      len = r12.length();
      bondType_->calcForce(len, potential_, dvdr);

      force = r12 * (-dvdr / len);

      atoms_[0]->addFrc(-force);
      atoms_[1]->addFrc(force);
      if (doParticlePot) {
        atoms_[0]->addParticlePot(potential_);
        atoms_[1]->addParticlePot(potential_);
      }
    }